

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance_test.cc
# Opt level: O0

void __thiscall
EditDistanceTestTestAllowReplacements::~EditDistanceTestTestAllowReplacements
          (EditDistanceTestTestAllowReplacements *this)

{
  EditDistanceTestTestAllowReplacements *this_local;
  
  ~EditDistanceTestTestAllowReplacements(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(EditDistanceTest, TestAllowReplacements) {
  bool allow_replacements = true;
  EXPECT_EQ(1, EditDistance("ninja", "njnja", allow_replacements));
  EXPECT_EQ(1, EditDistance("njnja", "ninja", allow_replacements));

  allow_replacements = false;
  EXPECT_EQ(2, EditDistance("ninja", "njnja", allow_replacements));
  EXPECT_EQ(2, EditDistance("njnja", "ninja", allow_replacements));
}